

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# biginteger.h
# Opt level: O1

BigInteger * __thiscall rapidjson::internal::BigInteger::operator*=(BigInteger *this,uint64_t u)

{
  ulong uVar1;
  Type TVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  long lVar6;
  ulong uVar7;
  long lVar8;
  
  if (u != 1) {
    if (u == 0) {
      this->digits_[0] = 0;
    }
    else {
      if ((this->count_ != 1) || (this->digits_[0] != 1)) {
        if (this->count_ == 0) {
          TVar2 = 0;
          uVar1 = 0;
        }
        else {
          uVar3 = 0;
          TVar2 = 0;
          do {
            uVar1 = this->digits_[uVar3] & 0xffffffff;
            uVar5 = this->digits_[uVar3] >> 0x20;
            uVar7 = uVar1 * (u & 0xffffffff);
            uVar4 = uVar5 * (u & 0xffffffff);
            lVar6 = uVar5 * (u >> 0x20);
            uVar1 = uVar1 * (u >> 0x20) + uVar4 + (uVar7 >> 0x20);
            lVar8 = lVar6 + 0x100000000;
            if (uVar4 <= uVar1) {
              lVar8 = lVar6;
            }
            uVar4 = (uVar7 & 0xffffffff) + TVar2 + (uVar1 << 0x20);
            TVar2 = (uVar1 >> 0x20) + lVar8 + (ulong)(uVar4 < TVar2);
            this->digits_[uVar3] = uVar4;
            uVar3 = uVar3 + 1;
            uVar1 = this->count_;
          } while (uVar3 < uVar1);
        }
        if (TVar2 == 0) {
          return this;
        }
        if (uVar1 < 0x1a0) {
          this->count_ = uVar1 + 1;
          this->digits_[uVar1] = TVar2;
          return this;
        }
        __assert_fail("count_ < kCapacity",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/rapidjson/internal/biginteger.h"
                      ,0xeb,"void rapidjson::internal::BigInteger::PushBack(Type)");
      }
      this->digits_[0] = u;
    }
    this->count_ = 1;
  }
  return this;
}

Assistant:

BigInteger& operator*=(uint64_t u) {
        if (u == 0) return *this = 0;
        if (u == 1) return *this;
        if (*this == 1) return *this = u;

        uint64_t k = 0;
        for (size_t i = 0; i < count_; i++) {
            uint64_t hi;
            digits_[i] = MulAdd64(digits_[i], u, k, &hi);
            k = hi;
        }
        
        if (k > 0)
            PushBack(k);

        return *this;
    }